

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

boolean test_move(int ux,int uy,int dx,int dy,int dz,int mode)

{
  level *plVar1;
  xchar x_00;
  boolean bVar2;
  schar sVar3;
  int iVar4;
  int y_01;
  int iVar5;
  int iVar6;
  char *pcVar7;
  trap *ptVar8;
  obj *poVar9;
  bool local_55;
  obj *obj;
  trap *t;
  rm *ust;
  rm *tmpr;
  int y;
  int x;
  int mode_local;
  int dz_local;
  int dy_local;
  int dx_local;
  int uy_local;
  int ux_local;
  xchar y_00;
  
  plVar1 = level;
  iVar4 = ux + dx;
  y_01 = uy + dy;
  x_00 = (xchar)iVar4;
  y_00 = (xchar)y_01;
  if ((level->locations[iVar4][y_01].typ < '\x11') || (level->locations[iVar4][y_01].typ == '\x16'))
  {
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) && (mode == 0)))) {
      feel_location(x_00,y_00);
    }
    if ((((u.uprops[0x3e].intrinsic == 0) && (u.uprops[0x3e].extrinsic == 0)) &&
        (((youmonst.data)->mflags1 & 8) == 0)) ||
       (bVar2 = may_passwall(level,x_00,y_00), bVar2 == '\0')) {
      if (plVar1->locations[iVar4][y_01].typ == '\x16') {
        if (((((mode == 0) && (flags.nopick == '\0')) &&
             (((youmonst.data)->mflags1 & 0x80000000) != 0)) &&
            (iVar5 = still_chewing(x_00,y_00), iVar5 != 0)) ||
           (((u.uprops[0x3e].intrinsic == 0 && (u.uprops[0x3e].extrinsic == 0)) &&
            ((((youmonst.data)->mflags1 & 8) == 0 &&
             (bVar2 = passes_bars(youmonst.data), bVar2 == '\0')))))) {
          return '\0';
        }
      }
      else {
        if ((((youmonst.data)->mflags1 & 0x20) == 0) || (((youmonst.data)->mflags1 & 0x40) != 0)) {
          if (((flags.autodig != '\0') &&
              (((flags.run == 0 && (flags.nopick == '\0')) && (uwep != (obj *)0x0)))) &&
             (((uwep->oclass == '\x02' || (uwep->oclass == '\x06')) &&
              (objects[uwep->otyp].oc_subtyp == '\x04')))) {
            if (mode == 0) {
              use_pick_axe2(uwep,(schar)dx,(schar)dy,(schar)dz);
            }
            return '\0';
          }
          if (mode == 0) {
            bVar2 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
            if ((bVar2 != '\0') && (bVar2 = is_db_wall(iVar4,y_01), bVar2 != '\0')) {
              pline("The drawbridge is up!");
            }
            if ((((u.uprops[0x3e].intrinsic != 0) || (u.uprops[0x3e].extrinsic != 0)) ||
                (((youmonst.data)->mflags1 & 8) != 0)) &&
               ((bVar2 = may_passwall(level,x_00,y_00), bVar2 == '\0' &&
                (u.uz.dnum == dungeon_topology.d_sokoban_dnum)))) {
              pline("The Sokoban walls resist your ability.");
            }
          }
          return '\0';
        }
        if ((mode == 0) && (iVar5 = still_chewing(x_00,y_00), iVar5 != 0)) {
          return '\0';
        }
      }
    }
  }
  else if (level->locations[iVar4][y_01].typ == '\x17') {
    bVar2 = closed_door(level,iVar4,y_01);
    if (bVar2 != '\0') {
      if ((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
          || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
         (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) && (mode == 0)))) {
        feel_location(x_00,y_00);
      }
      iVar5 = artifact_door(level,iVar4,y_01);
      if (iVar5 != 0) {
        if (mode == 0) {
          if (((youmonst.data)->mflags1 & 4) == 0) {
            if ((((youmonst.data)->mflags1 & 0x20) == 0) || (((youmonst.data)->mflags1 & 0x40) != 0)
               ) {
              if ((iVar4 == ux) || (y_01 == uy)) {
                if ((((u.uprops[0x1e].intrinsic == 0) &&
                     (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                      (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                    ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                   ((u.uprops[0x1b].intrinsic == 0 &&
                    ((((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')) &&
                      (sVar3 = acurr(3), '\t' < sVar3)) &&
                     ((u.uprops[0x25].intrinsic == 0 && (u.uprops[0x25].extrinsic == 0)))))))) {
                  pline("That door is closed.");
                }
                else {
                  pline("Ouch!  You bump into a heavy door.");
                  exercise(3,'\0');
                }
              }
            }
            else {
              pline("You hurt your teeth on the reinforced door.");
            }
          }
          else {
            pline("You try to ooze under the door, but the gap is too small.");
          }
        }
        return '\0';
      }
      if (((u.uprops[0x3e].intrinsic != 0) || (u.uprops[0x3e].extrinsic != 0)) ||
         (((youmonst.data)->mflags1 & 8) != 0)) goto LAB_001e275e;
      bVar2 = can_ooze(&youmonst);
      if (bVar2 != '\0') {
        if (mode == 0) {
          pline("You ooze under the door.");
        }
        goto LAB_001e275e;
      }
      if ((((youmonst.data)->mflags1 & 0x20) != 0) && (((youmonst.data)->mflags1 & 0x40) == 0)) {
        if ((mode == 0) && (iVar5 = still_chewing(x_00,y_00), iVar5 != 0)) {
          return '\0';
        }
        goto LAB_001e275e;
      }
      if (mode == 0) {
        if (((youmonst.data)->mflags1 & 4) == 0) {
          if ((iVar4 == ux) || (y_01 == uy)) {
            if ((((u.uprops[0x1e].intrinsic == 0) &&
                 (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
               ((u.uprops[0x1b].intrinsic == 0 &&
                (((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')) &&
                 ((sVar3 = acurr(3), '\t' < sVar3 &&
                  ((u.uprops[0x25].intrinsic == 0 && (u.uprops[0x25].extrinsic == 0)))))))))) {
              pline("That door is closed.");
            }
            else if (u.usteed == (monst *)0x0) {
              pline("Ouch!  You bump into a door.");
              exercise(3,'\0');
            }
            else {
              pcVar7 = y_monnam(u.usteed);
              pline("You can\'t lead %s through that closed door.",pcVar7);
            }
          }
        }
        else {
          pline("You try to ooze under the door, but can\'t squeeze your possessions through.");
        }
        return '\0';
      }
      if ((mode != 2) && (mode != 3)) {
        return '\0';
      }
    }
    if ((((dx != 0) && (dy != 0)) && (u.uprops[0x3e].intrinsic == 0)) &&
       (((u.uprops[0x3e].extrinsic == 0 && (((youmonst.data)->mflags1 & 8) == 0)) &&
        (((*(uint *)&plVar1->locations[iVar4][y_01].field_0x6 >> 4 & 0x1e) != 0 ||
         ((bVar2 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar2 != '\0' ||
          (bVar2 = block_door(x_00,y_00), bVar2 != '\0')))))))) {
      if (((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) && (mode == 0)))) {
        feel_location(x_00,y_00);
      }
      return '\0';
    }
  }
LAB_001e275e:
  if (((dx != 0) && (dy != 0)) &&
     ((bVar2 = bad_rock(youmonst.data,'\x01',(xchar)ux,y_00), bVar2 != '\0' &&
      (bVar2 = bad_rock(youmonst.data,'\x01',x_00,(xchar)uy), bVar2 != '\0')))) {
    if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
      if (mode == 0) {
        pline("You cannot pass that way.");
      }
      return '\0';
    }
    if (2 < (youmonst.data)->msize) {
      if (mode == 0) {
        pline("Your body is too large to fit through.");
      }
      return '\0';
    }
    if (invent != (obj *)0x0) {
      iVar5 = inv_weight();
      iVar6 = weight_cap();
      if (600 < iVar5 + iVar6) {
        if (mode == 0) {
          pline("You are carrying too much to get through.");
        }
        return '\0';
      }
    }
  }
  if (((flags.run == 8) && ((iVar4 != u.ux || (y_01 != u.uy)))) &&
     (((ptVar8 = t_at(level,iVar4,y_01), ptVar8 != (trap *)0x0 &&
       (((byte)ptVar8->field_0x8 >> 5 & 1) != 0)) ||
      ((((((((u.uprops[0x12].intrinsic == 0 && (u.uprops[0x12].extrinsic == 0)) &&
            ((youmonst.data)->mlet != '\x05')) &&
           ((u.uprops[0x3c].extrinsic == 0 && (((youmonst.data)->mflags1 & 1) == 0)))) &&
          ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) &&
         (((youmonst.data)->mflags1 & 0x10) == 0)) &&
        (((bVar2 = is_pool(level,iVar4,y_01), bVar2 != '\0' ||
          (bVar2 = is_lava(level,iVar4,y_01), bVar2 != '\0')) ||
         (bVar2 = is_swamp(level,iVar4,y_01), bVar2 != '\0')))) &&
       (level->locations[iVar4][y_01].seenv != '\0')))))) {
    if (mode == 0) {
      bVar2 = is_pool(level,iVar4,y_01);
      if (bVar2 == '\0') {
        bVar2 = is_lava(level,iVar4,y_01);
        if (bVar2 == '\0') {
          bVar2 = is_swamp(level,iVar4,y_01);
          if (bVar2 != '\0') {
            autoexplore_msg("a muddy swamp");
          }
        }
        else {
          autoexplore_msg("a pool of lava");
        }
      }
      else {
        autoexplore_msg("a body of water");
      }
      if (flags.travel != '\0') {
        return '\0';
      }
    }
    local_55 = mode == 3 || mode == 0;
    uy_local._3_1_ = local_55;
  }
  else if (mode == 3) {
    uy_local._3_1_ = false;
  }
  else if (((((dx == 0) || (dy == 0)) || (u.uprops[0x3e].intrinsic != 0)) ||
           (((u.uprops[0x3e].extrinsic != 0 || (((youmonst.data)->mflags1 & 8) != 0)) ||
            (level->locations[ux][uy].typ != '\x17')))) ||
          ((((*(uint *)&level->locations[ux][uy].field_0x6 >> 4 & 0x1e) == 0 &&
            (bVar2 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar2 == '\0')) &&
           (bVar2 = block_entry(x_00,y_00), bVar2 == '\0')))) {
    poVar9 = sobj_at(0x214,level,iVar4,y_01);
    if ((poVar9 != (obj *)0x0) &&
       ((u.uz.dnum == dungeon_topology.d_sokoban_dnum ||
        (((u.uprops[0x3e].intrinsic == 0 && (u.uprops[0x3e].extrinsic == 0)) &&
         (((youmonst.data)->mflags1 & 8) == 0)))))) {
      if ((((u.uprops[0x1e].intrinsic == 0) &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) &&
          ((1 < flags.run && (mode != 2)))))) {
        poVar9 = sobj_at(0x214,level,iVar4,y_01);
        if ((poVar9 != (obj *)0x0) && (mode == 0)) {
          autoexplore_msg("a boulder");
        }
        return '\0';
      }
      if (mode == 0) {
        if (((((youmonst.data)->mflags1 & 0x20) == 0) || (((youmonst.data)->mflags1 & 0x40) != 0))
           || (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) {
          iVar4 = moverock((schar)dx,(schar)dy);
          if (iVar4 < 0) {
            return '\0';
          }
        }
        else {
          iVar4 = still_chewing(x_00,y_00);
          if (iVar4 != 0) {
            return '\0';
          }
        }
      }
      else if (mode == 2) {
        if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
          return '\0';
        }
        poVar9 = sobj_at(0x214,level,ux,uy);
        if ((((((poVar9 != (obj *)0x0) && (u.uz.dnum != dungeon_topology.d_sokoban_dnum)) &&
              (u.uprops[0x3e].intrinsic == 0)) &&
             ((u.uprops[0x3e].extrinsic == 0 && (((youmonst.data)->mflags1 & 8) == 0)))) &&
            ((((youmonst.data)->mflags1 & 0x20) == 0 || (((youmonst.data)->mflags1 & 0x40) != 0))))
           && (((poVar9 = carrying(0x108), poVar9 == (obj *)0x0 &&
                (poVar9 = carrying(0x33), poVar9 == (obj *)0x0)) &&
               ((poVar9 = carrying(0x1cf), poVar9 == (obj *)0x0 ||
                ((objects[poVar9->otyp].field_0x10 & 1) != 0)))))) {
          return '\0';
        }
      }
    }
    uy_local._3_1_ = true;
  }
  else {
    if (mode == 0) {
      autoexplore_msg("the doorway");
    }
    uy_local._3_1_ = false;
  }
  return uy_local._3_1_;
}

Assistant:

boolean test_move(int ux, int uy, int dx, int dy, int dz, int mode)
{
    int x = ux+dx;
    int y = uy+dy;
    struct rm *tmpr = &level->locations[x][y];
    struct rm *ust;

    /*
     *  Check for physical obstacles.  First, the place we are going.
     */
    if (IS_ROCK(tmpr->typ) || tmpr->typ == IRONBARS) {
	if (Blind && mode == DO_MOVE) feel_location(x,y);
	if (Passes_walls && may_passwall(level, x,y)) {
	    ;	/* do nothing */
	} else if (tmpr->typ == IRONBARS) {
	    /* Eat the bars if you can. */
	    if ((mode == DO_MOVE && !flags.nopick &&
		 metallivorous(youmonst.data) && still_chewing(x, y)) ||
		!(Passes_walls || passes_bars(youmonst.data)))
		return FALSE;
	} else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
	    /* Eat the rock. */
	    if (mode == DO_MOVE && still_chewing(x,y)) return FALSE;
	} else if (flags.autodig && !flags.run && !flags.nopick &&
		   uwep && is_pick(uwep)) {
	    /* MRKR: Automatic digging when wielding the appropriate tool */
	    if (mode == DO_MOVE)
		use_pick_axe2(uwep, dx, dy, dz);
	    return FALSE;
	} else {
	    if (mode == DO_MOVE) {
		if (Is_stronghold(&u.uz) && is_db_wall(x,y))
		    pline("The drawbridge is up!");
		if (Passes_walls && !may_passwall(level, x,y) && In_sokoban(&u.uz))
		    pline("The Sokoban walls resist your ability.");
	    }
	    return FALSE;
	}
    } else if (IS_DOOR(tmpr->typ)) {
	if (closed_door(level, x,y)) {
	    if (Blind && mode == DO_MOVE) feel_location(x,y);
	    /* ALI - artifact doors */
	    if (artifact_door(level, x, y)) {
		if (mode == DO_MOVE) {
		    if (amorphous(youmonst.data)) {
			pline("You try to ooze under the door, "
			      "but the gap is too small.");
		    } else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
			pline("You hurt your teeth on the reinforced door.");
		    } else if (x == ux || y == uy) {
			if (Blind || Stunned || ACURR(A_DEX) < 10 || Fumbling) {
			    pline("Ouch!  You bump into a heavy door.");
			    exercise(A_DEX, FALSE);
			} else {
			    pline("That door is closed.");
			}
		    }
		}
		return FALSE;
	    } else if (Passes_walls)
		;	/* do nothing */
	    else if (can_ooze(&youmonst)) {
		if (mode == DO_MOVE) pline("You ooze under the door.");
	    } else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
		/* Eat the door. */
		if (mode == DO_MOVE && still_chewing(x,y)) return FALSE;
	    } else {
		if (mode == DO_MOVE) {
		    if (amorphous(youmonst.data))
			pline("You try to ooze under the door, but can't squeeze your possessions through.");
		    else if (x == ux || y == uy) {
			if (Blind || Stunned || ACURR(A_DEX) < 10 || Fumbling) {
			    if (u.usteed) {
				pline("You can't lead %s through that closed door.",
				         y_monnam(u.usteed));
			    } else {
			        pline("Ouch!  You bump into a door.");
			        exercise(A_DEX, FALSE);
			    }
			} else pline("That door is closed.");
		    }
		} else if (mode == TEST_TRAV || mode == TEST_TRAP) goto testdiag;
		return FALSE;
	    }
	} else {
	testdiag:
	    if (dx && dy && !Passes_walls
		&& ((tmpr->doormask & ~D_BROKEN)
		    || Is_rogue_level(&u.uz)
		    || block_door(x,y))) {
		/* Diagonal moves into a door are not allowed. */
		if (Blind && mode == DO_MOVE)
		    feel_location(x,y);
		return FALSE;
	    }
	}
    }
    if (dx && dy
	    && bad_rock(youmonst.data, TRUE, ux,y)
	    && bad_rock(youmonst.data, TRUE, x,uy)) {
	/* Move at a diagonal. */
	if (In_sokoban(&u.uz)) {
	    if (mode == DO_MOVE)
		pline("You cannot pass that way.");
	    return FALSE;
	}
	if (bigmonst(youmonst.data)) {
	    if (mode == DO_MOVE)
		pline("Your body is too large to fit through.");
	    return FALSE;
	}
	if (invent && (inv_weight() + weight_cap() > 600)) {
	    if (mode == DO_MOVE)
		pline("You are carrying too much to get through.");
	    return FALSE;
	}
    }
    /* Pick travel path that does not require crossing a trap.
     * Avoid water and lava using the usual running rules.
     * (but not u.ux/u.uy because findtravelpath walks toward u.ux/u.uy) */
    if (flags.run == 8 && (x != u.ux || y != u.uy)) {
	struct trap* t = t_at(level, x, y);

	if ((t && t->tseen) ||
	    (!Levitation && !Flying &&
	     !is_clinger(youmonst.data) &&
	     (is_pool(level, x, y) || is_lava(level, x, y) || is_swamp(level, x, y)) &&
	     level->locations[x][y].seenv)) {
	    if (mode == DO_MOVE) {
		if (is_pool(level, x, y)) autoexplore_msg("a body of water");
		else if (is_lava(level, x, y)) autoexplore_msg("a pool of lava");
		else if (is_swamp(level, x, y)) autoexplore_msg("a muddy swamp");
		if (flags.travel) return FALSE;
	    }
	    return mode == TEST_TRAP || mode == DO_MOVE;
	}
    }

    if (mode == TEST_TRAP) return FALSE; /* not a move through a trap */

    ust = &level->locations[ux][uy];

    /* Now see if other things block our way . . */
    if (dx && dy && !Passes_walls
		     && (IS_DOOR(ust->typ) && ((ust->doormask & ~D_BROKEN)
			     || Is_rogue_level(&u.uz)
			     || block_entry(x, y))
			 )) {
	/* Can't move at a diagonal out of a doorway with door. */
	if (mode == DO_MOVE)
	    autoexplore_msg("the doorway");
	return FALSE;
    }

    if (sobj_at(BOULDER, level, x, y) && (In_sokoban(&u.uz) || !Passes_walls)) {
	if (!(Blind || Hallucination) && (flags.run >= 2) && mode != TEST_TRAV) {
	    if (sobj_at(BOULDER, level, x, y) && mode == DO_MOVE)
		autoexplore_msg("a boulder");
	    return FALSE;
	}
	if (mode == DO_MOVE) {
	    /* tunneling monsters will chew before pushing */
	    if (tunnels(youmonst.data) && !needspick(youmonst.data) &&
		!In_sokoban(&u.uz)) {
		if (still_chewing(x,y)) return FALSE;
	    } else
		if (moverock(dx, dy) < 0) return FALSE;
	} else if (mode == TEST_TRAV) {
	    struct obj* obj;

	    /* never travel through boulders in Sokoban */
	    if (In_sokoban(&u.uz)) return FALSE;

	    /* don't pick two boulders in a row, unless there's a way thru */
	    if (sobj_at(BOULDER, level, ux,uy) && !In_sokoban(&u.uz)) {
		if (!Passes_walls &&
		    !(tunnels(youmonst.data) && !needspick(youmonst.data)) &&
		    !carrying(PICK_AXE) && !carrying(DWARVISH_MATTOCK) &&
		    !((obj = carrying(WAN_DIGGING)) &&
		      !objects[obj->otyp].oc_name_known))
		    return FALSE;
	    }
	}
	/* assume you'll be able to push it when you get there... */
    }

    /* OK, it is a legal place to move. */
    return TRUE;
}